

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O0

void __thiscall Assimp::glTF2Exporter::ExportMetadata(glTF2Exporter *this)

{
  aiMetadata *this_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  element_type *peVar4;
  char *pcVar5;
  bool local_556;
  allocator<char> local_541;
  string local_540;
  undefined1 local_51c [8];
  aiString copyright_str;
  char buffer [256];
  AssetMetadata *asset;
  glTF2Exporter *this_local;
  
  peVar4 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )&this->mAsset);
  std::__cxx11::string::operator=((string *)&(peVar4->asset).version,"2.0");
  uVar1 = aiGetVersionMajor();
  uVar2 = aiGetVersionMinor();
  uVar3 = aiGetVersionRevision();
  snprintf(copyright_str.data + 0x3f8,0x100,"Open Asset Import Library (assimp v%d.%d.%d)",
           (ulong)uVar1,(ulong)uVar2,(ulong)uVar3);
  std::__cxx11::string::operator=((string *)&(peVar4->asset).generator,copyright_str.data + 0x3f8);
  aiString::aiString((aiString *)local_51c);
  local_556 = false;
  if (this->mScene->mMetaData != (aiMetadata *)0x0) {
    this_00 = this->mScene->mMetaData;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_540,"SourceAsset_Copyright",&local_541);
    local_556 = aiMetadata::Get<aiString>(this_00,&local_540,(aiString *)local_51c);
    std::__cxx11::string::~string((string *)&local_540);
    std::allocator<char>::~allocator(&local_541);
  }
  if (local_556 != false) {
    pcVar5 = aiString::C_Str((aiString *)local_51c);
    std::__cxx11::string::operator=((string *)&peVar4->asset,pcVar5);
  }
  return;
}

Assistant:

void glTF2Exporter::ExportMetadata()
{
    AssetMetadata& asset = mAsset->asset;
    asset.version = "2.0";

    char buffer[256];
    ai_snprintf(buffer, 256, "Open Asset Import Library (assimp v%d.%d.%d)",
        aiGetVersionMajor(), aiGetVersionMinor(), aiGetVersionRevision());

    asset.generator = buffer;

    // Copyright
	aiString copyright_str;
	if (mScene->mMetaData != nullptr && mScene->mMetaData->Get(AI_METADATA_SOURCE_COPYRIGHT, copyright_str)) {
        asset.copyright = copyright_str.C_Str();
	}
}